

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_getsockopt(int s,int level,int option,void *optval,size_t *optvallen)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  long in_RCX;
  long in_R8;
  nn_sock *sock;
  int rc;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  nn_sock **in_stack_ffffffffffffffc0;
  FILE *__stream;
  uint in_stack_ffffffffffffffc8;
  uint option_00;
  int in_stack_ffffffffffffffcc;
  nn_sock *in_stack_ffffffffffffffd0;
  int local_24;
  
  iVar1 = nn_global_hold_socket(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  if (iVar1 < 0) {
    iVar1 = -iVar1;
    piVar2 = __errno_location();
    *piVar2 = iVar1;
  }
  else {
    option_00 = in_stack_ffffffffffffffc8 & 0xffffff;
    if (in_RCX == 0) {
      option_00 = CONCAT13(in_R8 != 0,(int3)in_stack_ffffffffffffffc8);
    }
    if ((char)(option_00 >> 0x18) == '\0') {
      local_24 = nn_sock_getopt(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,option_00,
                                in_stack_ffffffffffffffc0,
                                (size_t *)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      if (-1 < local_24) {
        if (local_24 == 0) {
          nn_global_rele_socket((nn_sock *)0x14dc97);
          return 0;
        }
        nn_backtrace_print();
        __stream = _stderr;
        pcVar3 = nn_err_strerror(in_stack_ffffffffffffffbc);
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)(uint)-local_24,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/core/global.c"
                ,0x253);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    else {
      local_24 = -0xe;
    }
    nn_global_rele_socket((nn_sock *)0x14dcab);
    local_24 = -local_24;
    piVar2 = __errno_location();
    *piVar2 = local_24;
  }
  return -1;
}

Assistant:

int nn_getsockopt (int s, int level, int option, void *optval,
    size_t *optvallen)
{
    int rc;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return -1;
    }

    if (nn_slow (!optval && optvallen)) {
        rc = -EFAULT;
        goto fail;
    }

    rc = nn_sock_getopt (sock, level, option, optval, optvallen);
    if (nn_slow (rc < 0))
        goto fail;
    errnum_assert (rc == 0, -rc);
    nn_global_rele_socket (sock);
    return 0;

fail:
    nn_global_rele_socket (sock);
    errno = -rc;
    return -1;
}